

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImageColor(Image *__return_storage_ptr__,int width,int height,Color color)

{
  void *pvVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = height * width;
  pvVar1 = calloc((long)(int)uVar3,4);
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      *(Color *)((long)pvVar1 + uVar2 * 4) = color;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageColor(int width, int height, Color color)
{
    Color *pixels = (Color *)RL_CALLOC(width*height, sizeof(Color));

    for (int i = 0; i < width*height; i++) pixels[i] = color;

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}